

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataStorage.cpp
# Opt level: O3

size_t __thiscall OpenMD::DataStorage::getSize(DataStorage *this)

{
  uint uVar1;
  
  uVar1 = this->storageLayout_;
  if (((uVar1 & 1) != 0) &&
     (((long)(this->position).
             super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
             _M_impl.super__Vector_impl_data._M_finish -
       (long)(this->position).
             super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
             _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 - this->size_ != 0
     )) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"size does not match",0x13);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'h');
    std::ostream::put('h');
    std::ostream::flush();
    uVar1 = this->storageLayout_;
  }
  if (((uVar1 & 2) != 0) &&
     (((long)(this->velocity).
             super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
             _M_impl.super__Vector_impl_data._M_finish -
       (long)(this->velocity).
             super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
             _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 - this->size_ != 0
     )) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"size does not match",0x13);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'h');
    std::ostream::put('h');
    std::ostream::flush();
    uVar1 = this->storageLayout_;
  }
  if (((uVar1 & 4) != 0) &&
     (((long)(this->force).
             super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
             _M_impl.super__Vector_impl_data._M_finish -
       (long)(this->force).
             super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
             _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 - this->size_ != 0
     )) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"size does not match",0x13);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'h');
    std::ostream::put('h');
    std::ostream::flush();
    uVar1 = this->storageLayout_;
  }
  if (((uVar1 & 8) != 0) &&
     (((long)(this->aMat).
             super__Vector_base<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)(this->aMat).
             super__Vector_base<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>
             ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7 - this->size_ !=
      0)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"size does not match",0x13);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'h');
    std::ostream::put('h');
    std::ostream::flush();
    uVar1 = this->storageLayout_;
  }
  if (((uVar1 & 0x10) != 0) &&
     (((long)(this->angularMomentum).
             super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
             _M_impl.super__Vector_impl_data._M_finish -
       (long)(this->angularMomentum).
             super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
             _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 - this->size_ != 0
     )) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"size does not match",0x13);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'h');
    std::ostream::put('h');
    std::ostream::flush();
    uVar1 = this->storageLayout_;
  }
  if (((uVar1 & 0x20) != 0) &&
     (((long)(this->torque).
             super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
             _M_impl.super__Vector_impl_data._M_finish -
       (long)(this->torque).
             super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
             _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 - this->size_ != 0
     )) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"size does not match",0x13);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'h');
    std::ostream::put('h');
    std::ostream::flush();
    uVar1 = this->storageLayout_;
  }
  if (((uVar1 & 0x40) != 0) &&
     ((long)(this->particlePot).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(this->particlePot).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start >> 3 != this->size_)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"size does not match",0x13);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'h');
    std::ostream::put('h');
    std::ostream::flush();
    uVar1 = this->storageLayout_;
  }
  if (((char)uVar1 < '\0') &&
     ((long)(this->density).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(this->density).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start >> 3 != this->size_)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"size does not match",0x13);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'h');
    std::ostream::put('h');
    std::ostream::flush();
    uVar1 = this->storageLayout_;
  }
  if (((uVar1 >> 8 & 1) != 0) &&
     ((long)(this->functional).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(this->functional).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start >> 3 != this->size_)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"size does not match",0x13);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'h');
    std::ostream::put('h');
    std::ostream::flush();
    uVar1 = this->storageLayout_;
  }
  if (((uVar1 >> 9 & 1) != 0) &&
     ((long)(this->functionalDerivative).super__Vector_base<double,_std::allocator<double>_>._M_impl
            .super__Vector_impl_data._M_finish -
      (long)(this->functionalDerivative).super__Vector_base<double,_std::allocator<double>_>._M_impl
            .super__Vector_impl_data._M_start >> 3 != this->size_)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"size does not match",0x13);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'h');
    std::ostream::put('h');
    std::ostream::flush();
    uVar1 = this->storageLayout_;
  }
  if (((uVar1 >> 10 & 1) != 0) &&
     (((long)(this->dipole).
             super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
             _M_impl.super__Vector_impl_data._M_finish -
       (long)(this->dipole).
             super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
             _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 - this->size_ != 0
     )) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"size does not match",0x13);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'h');
    std::ostream::put('h');
    std::ostream::flush();
    uVar1 = this->storageLayout_;
  }
  if (((uVar1 >> 0xb & 1) != 0) &&
     (((long)(this->quadrupole).
             super__Vector_base<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)(this->quadrupole).
             super__Vector_base<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>
             ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7 - this->size_ !=
      0)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"size does not match",0x13);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'h');
    std::ostream::put('h');
    std::ostream::flush();
    uVar1 = this->storageLayout_;
  }
  if (((uVar1 >> 0xc & 1) != 0) &&
     (((long)(this->electricField).
             super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
             _M_impl.super__Vector_impl_data._M_finish -
       (long)(this->electricField).
             super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
             _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 - this->size_ != 0
     )) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"size does not match",0x13);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'h');
    std::ostream::put('h');
    std::ostream::flush();
    uVar1 = this->storageLayout_;
  }
  if (((uVar1 >> 0xd & 1) != 0) &&
     ((long)(this->skippedCharge).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(this->skippedCharge).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start >> 3 != this->size_)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"size does not match",0x13);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'h');
    std::ostream::put('h');
    std::ostream::flush();
    uVar1 = this->storageLayout_;
  }
  if (((uVar1 >> 0xe & 1) != 0) &&
     ((long)(this->flucQPos).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(this->flucQPos).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start >> 3 != this->size_)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"size does not match",0x13);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'h');
    std::ostream::put('h');
    std::ostream::flush();
    uVar1 = this->storageLayout_;
  }
  if (((short)uVar1 < 0) &&
     ((long)(this->flucQVel).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(this->flucQVel).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start >> 3 != this->size_)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"size does not match",0x13);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'h');
    std::ostream::put('h');
    std::ostream::flush();
    uVar1 = this->storageLayout_;
  }
  if (((uVar1 >> 0x10 & 1) != 0) &&
     ((long)(this->flucQFrc).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(this->flucQFrc).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start >> 3 != this->size_)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"size does not match",0x13);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'h');
    std::ostream::put('h');
    std::ostream::flush();
    uVar1 = this->storageLayout_;
  }
  if (((uVar1 >> 0x11 & 1) != 0) &&
     ((long)(this->sitePotential).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(this->sitePotential).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start >> 3 != this->size_)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"size does not match",0x13);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'h');
    std::ostream::put('h');
    std::ostream::flush();
  }
  return this->size_;
}

Assistant:

std::size_t DataStorage::getSize() {
    if (storageLayout_ & dslPosition && position.size() != size_) {
      // error
      cerr << "size does not match" << endl;
    }

    if (storageLayout_ & dslVelocity && velocity.size() != size_) {
      // error
      cerr << "size does not match" << endl;
    }

    if (storageLayout_ & dslForce && force.size() != size_) {
      // error
      cerr << "size does not match" << endl;
    }

    if (storageLayout_ & dslAmat && aMat.size() != size_) {
      // error
      cerr << "size does not match" << endl;
    }

    if (storageLayout_ & dslAngularMomentum &&
        angularMomentum.size() != size_) {
      // error
      cerr << "size does not match" << endl;
    }

    if (storageLayout_ & dslTorque && torque.size() != size_) {
      // error
      cerr << "size does not match" << endl;
    }

    if (storageLayout_ & dslParticlePot && particlePot.size() != size_) {
      // error
      cerr << "size does not match" << endl;
    }

    if (storageLayout_ & dslDensity && density.size() != size_) {
      // error
      cerr << "size does not match" << endl;
    }

    if (storageLayout_ & dslFunctional && functional.size() != size_) {
      // error
      cerr << "size does not match" << endl;
    }

    if (storageLayout_ & dslFunctionalDerivative &&
        functionalDerivative.size() != size_) {
      // error
      cerr << "size does not match" << endl;
    }

    if (storageLayout_ & dslDipole && dipole.size() != size_) {
      // error
      cerr << "size does not match" << endl;
    }

    if (storageLayout_ & dslQuadrupole && quadrupole.size() != size_) {
      // error
      cerr << "size does not match" << endl;
    }

    if (storageLayout_ & dslElectricField && electricField.size() != size_) {
      // error
      cerr << "size does not match" << endl;
    }

    if (storageLayout_ & dslSkippedCharge && skippedCharge.size() != size_) {
      // error
      cerr << "size does not match" << endl;
    }

    if (storageLayout_ & dslFlucQPosition && flucQPos.size() != size_) {
      // error
      cerr << "size does not match" << endl;
    }

    if (storageLayout_ & dslFlucQVelocity && flucQVel.size() != size_) {
      // error
      cerr << "size does not match" << endl;
    }

    if (storageLayout_ & dslFlucQForce && flucQFrc.size() != size_) {
      // error
      cerr << "size does not match" << endl;
    }

    if (storageLayout_ & dslSitePotential && sitePotential.size() != size_) {
      // error
      cerr << "size does not match" << endl;
    }

    return size_;
  }